

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccumulatorView.hpp
# Opt level: O0

void __thiscall
OpenMD::Utils::AccumulatorView<OpenMD::Utils::Accumulator<double>_>::writeErrorBars
          (AccumulatorView<OpenMD::Utils::Accumulator<double>_> *this,ostream *stream,
          string *errorMessage,ErrorHandling errorHandling)

{
  uint uVar1;
  Accumulator<double> *this_00;
  undefined8 uVar2;
  ostream *this_01;
  int in_ECX;
  ostream *in_RSI;
  Accumulator<double> *in_RDI;
  size_t count;
  RealType err;
  double local_28;
  
  local_28 = 0.0;
  this_00 = (Accumulator<double> *)
            Accumulator<double>::getCount((Accumulator<double> *)&in_RDI->Val_);
  if (in_ECX == 0) {
    local_28 = Accumulator<double>::get95percentConfidenceInterval(this_00);
  }
  else if (in_ECX == 1) {
    local_28 = Accumulator<double>::getStdDev(in_RDI);
  }
  else if (in_ECX == 2) {
    local_28 = Accumulator<double>::getVariance((Accumulator<double> *)&in_RDI->Val_);
  }
  if ((this_00 == (Accumulator<double> *)0x0) && (in_ECX == 0)) {
    std::operator<<(in_RSI,"\t");
  }
  else {
    uVar1 = std::isinf(local_28);
    if (((uVar1 & 1) == 0) && (uVar1 = std::isnan(local_28), (uVar1 & 1) == 0)) {
      if (this_00 == (Accumulator<double> *)0x0) {
        std::operator<<(in_RSI,"\t");
      }
      else {
        this_01 = std::operator<<(in_RSI,"\t");
        std::ostream::operator<<(this_01,local_28);
      }
    }
    else {
      uVar2 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"%s",uVar2);
      painCave.isFatal = 1;
      simError();
    }
  }
  return;
}

Assistant:

void writeErrorBars(std::ostream& stream, const std::string& errorMessage,
                        ErrorHandling errorHandling) const override {
      RealType err {};
      std::size_t count = RealAccumulator::getCount();

      switch (errorHandling) {
      case ErrorHandling::CI95:
        err = RealAccumulator::get95percentConfidenceInterval();
        break;
      case ErrorHandling::StdDev:
        err = RealAccumulator::getStdDev();
        break;
      case ErrorHandling::Variance:
        err = RealAccumulator::getVariance();
        break;
      default:
        break;
      }

      if (count == 0 && errorHandling == ErrorHandling::CI95) {
        stream << "\t";
      } else {
        if (std::isinf(err) || std::isnan(err)) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s",
                   errorMessage.c_str());
          painCave.isFatal = 1;
          simError();
        } else {
          if (count == 0)
            stream << "\t";
          else
            stream << "\t" << err;
        }
      }
    }